

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

MainLoopResult * __thiscall Saturation::SaturationAlgorithm::runImpl(SaturationAlgorithm *this)

{
  ulong uVar1;
  undefined8 uVar2;
  long in_RSI;
  SaturationAlgorithm *unaff_retaddr;
  ThrowableBase *anon_var_0;
  uint startTime;
  ActivationLimitExceededException *in_stack_ffffffffffffffc0;
  
  uVar1 = Lib::Timer::elapsedDeciseconds();
  *(undefined4 *)(DAT_01333840 + 0x1d0) = 0;
  do {
    doOneAlgorithmStep(unaff_retaddr);
    if ((*(int *)(in_RSI + 0x14c) != 0) &&
       (*(uint *)(in_RSI + 0x14c) < *(uint *)(DAT_01333840 + 0x1d0))) {
      uVar2 = __cxa_allocate_exception(0x28);
      Lib::ActivationLimitExceededException::ActivationLimitExceededException
                (in_stack_ffffffffffffffc0);
      __cxa_throw(uVar2,&Lib::ActivationLimitExceededException::typeinfo,
                  Lib::ActivationLimitExceededException::~ActivationLimitExceededException);
    }
  } while ((*(int *)(in_RSI + 0x150) == 0) ||
          (in_stack_ffffffffffffffc0 =
                (ActivationLimitExceededException *)Lib::Timer::elapsedDeciseconds(),
          (long)((long)in_stack_ffffffffffffffc0 - (uVar1 & 0xffffffff)) <=
          (long)(ulong)*(uint *)(in_RSI + 0x150)));
  uVar2 = __cxa_allocate_exception(0x28);
  Lib::TimeLimitExceededException::TimeLimitExceededException
            ((TimeLimitExceededException *)in_stack_ffffffffffffffc0);
  __cxa_throw(uVar2,&Lib::TimeLimitExceededException::typeinfo,
              Lib::TimeLimitExceededException::~TimeLimitExceededException);
}

Assistant:

MainLoopResult SaturationAlgorithm::runImpl()
{
  // could be more precise, but we don't care too much
  unsigned startTime = Timer::elapsedDeciseconds();
  try {
    env.statistics->activations = 0;
    while (true) {
      doOneAlgorithmStep(); // will bump env.statistics->activations by one

      if (_activationLimit && env.statistics->activations > _activationLimit) {
        throw ActivationLimitExceededException();
      }
      if(_softTimeLimit && Timer::elapsedDeciseconds() - startTime > _softTimeLimit)
        throw TimeLimitExceededException();
    }
  }
  catch (ThrowableBase&) {
    tryUpdateFinalClauseCount();
    throw;
  }
}